

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O3

void __thiscall
Memory::
SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::
FinishPartialCollect
          (SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
           *this,RecyclerSweep *recyclerSweep)

{
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_00;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  Recycler *pRVar4;
  undefined4 *puVar5;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *pSVar6;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *pSVar7;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> **in_R8;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *tail_1;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> **ppSVar8;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *list;
  anon_class_16_2_3fe61e0b fn;
  undefined1 local_30 [8];
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *tail;
  
  if (recyclerSweep == (RecyclerSweep *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = RecyclerSweep::IsBackground(recyclerSweep);
  }
  HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::
  VerifyHeapBlockCount
            (&this->
              super_HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
             ,bVar2);
  pRVar4 = HeapBucket::GetRecycler((HeapBucket *)this);
  if (pRVar4->inPartialCollectMode == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x253,"(this->GetRecycler()->inPartialCollectMode)",
                       "this->GetRecycler()->inPartialCollectMode");
    if (!bVar2) goto LAB_007497ac;
    *puVar5 = 0;
  }
  if (recyclerSweep != (RecyclerSweep *)0x0) {
    bVar2 = HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::
            IsAllocationStopped(&this->
                                 super_HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
                               );
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,600,"(recyclerSweep == nullptr || this->IsAllocationStopped())",
                         "recyclerSweep == nullptr || this->IsAllocationStopped()");
      if (!bVar2) goto LAB_007497ac;
      *puVar5 = 0;
    }
  }
  list = this->partialSweptHeapBlockList;
  if (list == (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    list = this->partialHeapBlockList;
  }
  else {
    this->partialSweptHeapBlockList =
         (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    local_30 = (undefined1  [8])0x0;
    fn.tail = in_R8;
    fn.this = (SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
               *)local_30;
    HeapBlockList::
    ForEach<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>,Memory::SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>::FinishPartialCollect(Memory::RecyclerSweep*)::_lambda(Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
              ((HeapBlockList *)list,
               (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0,
               (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)this,fn);
    if (local_30 == (undefined1  [8])0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,0x268,"(tail != nullptr)","tail != nullptr");
      if (!bVar2) {
LAB_007497ac:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    *(SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> **)((long)local_30 + 0x20) =
         this->partialHeapBlockList;
    this->partialHeapBlockList = list;
  }
  if (recyclerSweep == (RecyclerSweep *)0x0) {
    if (list != (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      this->partialHeapBlockList =
           (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::
      AppendAllocableHeapBlockList
                (&this->
                  super_HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
                 ,list);
    }
    bVar2 = false;
  }
  else {
    if (list != (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      this->partialHeapBlockList =
           (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      pSVar7 = (this->
               super_HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
               ).heapBlockList;
      if (pSVar7 == (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
        ppSVar8 = &(this->
                   super_HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
                   ).heapBlockList;
      }
      else {
        do {
          pSVar6 = pSVar7;
          this_00 = (pSVar6->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
                    super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
          if (this_00 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
          pSVar7 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>
                             (&this_00->super_HeapBlock);
        } while (pSVar7 != (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0);
        ppSVar8 = (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> **)
                  &(pSVar6->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
                   super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
      }
      *ppSVar8 = list;
    }
    uVar3 = HeapBucket::GetMediumBucketIndex((HeapBucket *)this);
    if ((recyclerSweep->mediumFinalizableData).bucketData[uVar3].pendingSweepList ==
        (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::
      StartAllocationAfterSweep
                (&this->
                  super_HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
                );
    }
    bVar2 = RecyclerSweep::IsBackground(recyclerSweep);
  }
  HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::
  VerifyHeapBlockCount
            (&this->
              super_HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
             ,bVar2);
  return;
}

Assistant:

void
SmallNormalHeapBucketBase<TBlockType>::FinishPartialCollect(RecyclerSweep * recyclerSweep)
{
    RECYCLER_SLOW_CHECK(this->VerifyHeapBlockCount(recyclerSweep != nullptr && recyclerSweep->IsBackground()));

    Assert(this->GetRecycler()->inPartialCollectMode);

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    Assert(recyclerSweep == nullptr || this->IsAllocationStopped() || this->AllocationsStartedDuringConcurrentSweep());
#else
    Assert(recyclerSweep == nullptr || this->IsAllocationStopped());
#endif

#if ENABLE_CONCURRENT_GC
    // Process the partial Swept block and move it to the partial heap block list
    TBlockType * partialSweptList = this->partialSweptHeapBlockList;
    if (partialSweptList)
    {
        this->partialSweptHeapBlockList = nullptr;
        TBlockType *  tail = nullptr;
        HeapBlockList::ForEach(partialSweptList, [this, &tail](TBlockType * heapBlock)
        {
            heapBlock->FinishPartialCollect();
            Assert(heapBlock->HasFreeObject());
            tail = heapBlock;
        });
        Assert(tail != nullptr);
        tail->SetNextBlock(this->partialHeapBlockList);
        this->partialHeapBlockList = partialSweptList;
    }
#endif

    TBlockType * currentPartialHeapBlockList = this->partialHeapBlockList;
    if (recyclerSweep == nullptr)
    {
        if (currentPartialHeapBlockList != nullptr)
        {
            this->partialHeapBlockList = nullptr;
            this->AppendAllocableHeapBlockList(currentPartialHeapBlockList);
        }
    }
    else
    {
        if (currentPartialHeapBlockList != nullptr)
        {
            this->partialHeapBlockList = nullptr;
            TBlockType * list = this->heapBlockList;
            if (list == nullptr)
            {
                this->heapBlockList = currentPartialHeapBlockList;
            }
            else
            {
                // CONCURRENT-TODO: Optimize this?
                TBlockType * tail = HeapBlockList::Tail(this->heapBlockList);
                tail->SetNextBlock(currentPartialHeapBlockList);
            }
        }
#if ENABLE_CONCURRENT_GC
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        if (recyclerSweep->GetPendingSweepBlockList(this) == nullptr && !this->AllocationsStartedDuringConcurrentSweep())
#else
        if (recyclerSweep->GetPendingSweepBlockList(this) == nullptr)
#endif
#endif
        {
            // nothing else to sweep now,  we can start allocating now.
            this->StartAllocationAfterSweep();
        }
    }

    RECYCLER_SLOW_CHECK(this->VerifyHeapBlockCount(recyclerSweep != nullptr && recyclerSweep->IsBackground()));
}